

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generics.c++
# Opt level: O3

bool __thiscall
capnp::compiler::BrandedDecl::compileAsType
          (BrandedDecl *this,ErrorReporter *errorReporter,Builder target)

{
  uint uVar1;
  void *pvVar2;
  Builder target_00;
  Reader name;
  CapTableBuilder *pCVar3;
  anon_class_8_1_a7dcfa9e aVar4;
  bool bVar5;
  uint64_t uVar6;
  void *pvVar7;
  SegmentBuilder *pSVar8;
  char *pcVar9;
  ulong uVar10;
  ulong uVar11;
  uint uVar12;
  char (*in_R8) [17];
  undefined8 uVar13;
  ResolvedParameter RVar14;
  Builder interface;
  SegmentReader *pSVar15;
  CapTableReader *pCVar16;
  WirePointer *pWVar17;
  undefined8 uVar18;
  StructBuilder local_98;
  anon_class_8_1_a7dcfa9e local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 in_stack_ffffffffffffffb0;
  undefined1 in_stack_ffffffffffffffb8 [16];
  undefined8 in_stack_ffffffffffffffc8;
  undefined8 in_stack_ffffffffffffffd0;
  undefined8 in_stack_ffffffffffffffd8;
  
  if ((this->body).tag == 2) {
    RVar14 = asVariable(this);
    *(undefined2 *)target._builder.data = 0x12;
    *(undefined4 *)((long)target._builder.data + 8) = 0;
    *(undefined8 *)((long)target._builder.data + 0x10) = 0;
    if (RVar14.id == 0) {
      *(undefined2 *)((long)target._builder.data + 8) = 2;
    }
    else {
      *(undefined2 *)((long)target._builder.data + 8) = 1;
      *(uint64_t *)((long)target._builder.data + 0x10) = RVar14.id;
    }
    *(short *)((long)target._builder.data + 10) = (short)RVar14.index;
    return true;
  }
  switch(*(undefined2 *)((long)&(this->body).field_1 + 0x18)) {
  case 0:
  case 1:
  case 2:
  case 4:
  case 6:
  case 7:
  case 8:
  case 10:
  case 0xb:
  case 0xc:
  case 0xd:
    pSVar15 = (this->source)._reader.segment;
    pCVar16 = (this->source)._reader.capTable;
    pvVar7 = (this->source)._reader.data;
    pWVar17 = (this->source)._reader.pointers;
    uVar13._0_4_ = (this->source)._reader.dataSize;
    uVar13._4_2_ = (this->source)._reader.pointerCount;
    uVar13._6_2_ = *(undefined2 *)&(this->source)._reader.field_0x26;
    uVar18 = *(undefined8 *)&(this->source)._reader.nestingLimit;
    name._reader._8_16_ = in_stack_ffffffffffffffb8;
    name._reader.segment = (SegmentReader *)in_stack_ffffffffffffffb0;
    name._reader.pointers = (WirePointer *)in_stack_ffffffffffffffc8;
    name._reader._32_8_ = in_stack_ffffffffffffffd0;
    name._reader._40_8_ = in_stack_ffffffffffffffd8;
    expressionString(name);
    kj::str<char_const(&)[2],kj::String,char_const(&)[17]>
              ((String *)&local_98,(kj *)0x1c0ea5,(char (*) [2])&stack0xffffffffffffff98,
               (String *)"\' is not a type.",in_R8);
    pSVar8 = local_98.segment;
    if (local_98.capTable == (CapTableBuilder *)0x0) {
      pSVar8 = (SegmentBuilder *)0x1d857d;
    }
    uVar12 = (this->source)._reader.dataSize;
    uVar10 = 0;
    if (uVar12 < 0x40) {
      uVar11 = 0;
    }
    else {
      pvVar2 = (this->source)._reader.data;
      uVar11 = (ulong)*(uint *)((long)pvVar2 + 4);
      if (0x9f < uVar12) {
        uVar10 = (ulong)*(uint *)((long)pvVar2 + 0x10);
      }
    }
    (**errorReporter->_vptr_ErrorReporter)
              (errorReporter,uVar11,uVar10,pSVar8,
               (long)&((local_98.capTable)->super_CapTableReader)._vptr_CapTableReader +
               (ulong)(local_98.capTable == (CapTableBuilder *)0x0));
    pCVar3 = local_98.capTable;
    pSVar8 = local_98.segment;
    if (local_98.segment != (SegmentBuilder *)0x0) {
      local_98.segment = (SegmentBuilder *)0x0;
      local_98.capTable = (CapTableBuilder *)0x0;
      (*(code *)**local_98.data)
                (local_98.data,pSVar8,1,pCVar3,pCVar3,0,pSVar15,pCVar16,pvVar7,pWVar17,uVar13,uVar18
                );
    }
    uVar13 = uStack_60;
    aVar4.enum_ = local_68.enum_;
    if ((BrandedDecl *)local_68.enum_ == (BrandedDecl *)0x0) {
      return false;
    }
    local_68.enum_ = (Builder *)0x0;
    uStack_60 = (CapTableBuilder *)0x0;
    (*(code *)**(undefined8 **)local_58)(local_58,aVar4.enum_,1,uVar13,uVar13,0);
    return false;
  case 3:
    capnp::schema::Type::Builder::initEnum((Builder *)&local_98,&target);
    local_68.enum_ = (Builder *)&local_98;
    uVar6 = getIdAndFillBrand<capnp::compiler::BrandedDecl::compileAsType(capnp::compiler::ErrorReporter&,capnp::schema::Type::Builder)::__0>
                      (this,&stack0xffffffffffffff98);
    goto LAB_001230d7;
  case 5:
    capnp::schema::Type::Builder::initStruct((Builder *)&local_98,&target);
    local_68.enum_ = (Builder *)&local_98;
    uVar6 = getIdAndFillBrand<capnp::compiler::BrandedDecl::compileAsType(capnp::compiler::ErrorReporter&,capnp::schema::Type::Builder)::__1>
                      (this,(anon_class_8_1_1336220a *)&stack0xffffffffffffff98);
    goto LAB_001230d7;
  case 9:
    capnp::schema::Type::Builder::initInterface((Builder *)&local_98,&target);
    local_68.enum_ = (Builder *)&local_98;
    uVar6 = getIdAndFillBrand<capnp::compiler::BrandedDecl::compileAsType(capnp::compiler::ErrorReporter&,capnp::schema::Type::Builder)::__2>
                      (this,(anon_class_8_1_338df3d9 *)&stack0xffffffffffffff98);
LAB_001230d7:
    *(uint64_t *)((long)local_98.data + 8) = uVar6;
    break;
  case 0xe:
    *(undefined2 *)target._builder.data = 0;
    break;
  case 0xf:
    *(undefined2 *)target._builder.data = 1;
    break;
  case 0x10:
    *(undefined2 *)target._builder.data = 2;
    break;
  case 0x11:
    *(undefined2 *)target._builder.data = 3;
    break;
  case 0x12:
    *(undefined2 *)target._builder.data = 4;
    break;
  case 0x13:
    *(undefined2 *)target._builder.data = 5;
    break;
  case 0x14:
    *(undefined2 *)target._builder.data = 6;
    break;
  case 0x15:
    *(undefined2 *)target._builder.data = 7;
    break;
  case 0x16:
    *(undefined2 *)target._builder.data = 8;
    break;
  case 0x17:
    *(undefined2 *)target._builder.data = 9;
    break;
  case 0x18:
    *(undefined2 *)target._builder.data = 10;
    break;
  case 0x19:
    *(undefined2 *)target._builder.data = 0xb;
    break;
  case 0x1a:
    *(undefined2 *)target._builder.data = 0xc;
    break;
  case 0x1b:
    *(undefined2 *)target._builder.data = 0xd;
    break;
  case 0x1c:
    capnp::schema::Type::Builder::initList((Builder *)&stack0xffffffffffffff98,&target);
    capnp::_::PointerBuilder::initStruct
              (&local_98,(PointerBuilder *)&stack0xffffffffffffffc8,(StructSize)0x10003);
    getListParam((BrandedDecl *)&stack0xffffffffffffff98);
    if ((BrandedDecl *)local_68.enum_ == (BrandedDecl *)0x0) {
      uVar12 = (this->source)._reader.dataSize;
      uVar10 = 0;
      if (uVar12 < 0x40) {
        uVar11 = 0;
      }
      else {
        pvVar7 = (this->source)._reader.data;
        uVar11 = (ulong)*(uint *)((long)pvVar7 + 4);
        if (0x9f < uVar12) {
          uVar10 = (ulong)*(uint *)((long)pvVar7 + 0x10);
        }
      }
      (**errorReporter->_vptr_ErrorReporter)
                (errorReporter,uVar11,uVar10,"\'List\' requires exactly one parameter.",0x27);
      return false;
    }
    target_00._builder.capTable = local_98.capTable;
    target_00._builder.segment = local_98.segment;
    target_00._builder.data = local_98.data;
    target_00._builder.pointers = local_98.pointers;
    target_00._builder.dataSize = local_98.dataSize;
    target_00._builder.pointerCount = local_98.pointerCount;
    target_00._builder._38_2_ = local_98._38_2_;
    bVar5 = compileAsType((BrandedDecl *)local_68.enum_,errorReporter,target_00);
    if (!bVar5) {
      return false;
    }
    if (*local_98.data != 0x12) {
      return true;
    }
    if (*(short *)((long)local_98.data + 10) == 1) {
      uVar12 = (this->source)._reader.dataSize;
      if (uVar12 < 0x40) {
        uVar13 = 0x24;
        pcVar9 = "\'List(AnyStruct)\' is not supported.";
        goto LAB_001232e7;
      }
      pvVar7 = (this->source)._reader.data;
      uVar1 = *(uint *)((long)pvVar7 + 4);
      uVar13 = 0x24;
      pcVar9 = "\'List(AnyStruct)\' is not supported.";
    }
    else {
      if (*(short *)((long)local_98.data + 10) != 0) {
        return true;
      }
      uVar12 = (this->source)._reader.dataSize;
      if (uVar12 < 0x40) {
        uVar13 = 0x25;
        pcVar9 = "\'List(AnyPointer)\' is not supported.";
LAB_001232e7:
        uVar10 = 0;
        uVar11 = 0;
        goto LAB_00123326;
      }
      pvVar7 = (this->source)._reader.data;
      uVar1 = *(uint *)((long)pvVar7 + 4);
      uVar13 = 0x25;
      pcVar9 = "\'List(AnyPointer)\' is not supported.";
    }
    uVar11 = (ulong)uVar1;
    uVar10 = 0;
    if (0x9f < uVar12) {
      uVar10 = (ulong)*(uint *)((long)pvVar7 + 0x10);
    }
LAB_00123326:
    (**errorReporter->_vptr_ErrorReporter)(errorReporter,uVar11,uVar10,pcVar9,uVar13);
    *(short *)local_98.data = 0;
    return false;
  case 0x1d:
    uVar12 = (this->source)._reader.dataSize;
    uVar10 = 0;
    if (uVar12 < 0x40) {
      uVar11 = 0;
    }
    else {
      pvVar7 = (this->source)._reader.data;
      uVar11 = (ulong)*(uint *)((long)pvVar7 + 4);
      if (0x9f < uVar12) {
        uVar10 = (ulong)*(uint *)((long)pvVar7 + 0x10);
      }
    }
    (**errorReporter->_vptr_ErrorReporter)
              (errorReporter,uVar11,uVar10,
               "As of Cap\'n Proto 0.4, \'Object\' has been renamed to \'AnyPointer\'.  Sorry for the inconvenience, and thanks for being an early adopter.  :)"
               ,0x8b);
  case 0x1e:
    *(undefined2 *)target._builder.data = 0x12;
    *(undefined4 *)((long)target._builder.data + 8) = 0;
    *(undefined8 *)((long)target._builder.data + 0x10) = 0;
    *(undefined4 *)((long)target._builder.data + 8) = 0;
    break;
  case 0x1f:
    *(undefined2 *)target._builder.data = 0x12;
    *(undefined4 *)((long)target._builder.data + 8) = 0;
    *(undefined8 *)((long)target._builder.data + 0x10) = 0;
    *(undefined4 *)((long)target._builder.data + 8) = 0x10000;
    break;
  case 0x20:
    *(undefined2 *)target._builder.data = 0x12;
    *(undefined4 *)((long)target._builder.data + 8) = 0;
    *(undefined8 *)((long)target._builder.data + 0x10) = 0;
    *(undefined4 *)((long)target._builder.data + 8) = 0x20000;
    break;
  case 0x21:
    *(undefined2 *)target._builder.data = 0x12;
    *(undefined4 *)((long)target._builder.data + 8) = 0;
    *(undefined8 *)((long)target._builder.data + 0x10) = 0;
    *(undefined4 *)((long)target._builder.data + 8) = 0x30000;
    break;
  default:
    kj::_::unreachable();
  }
  return true;
}

Assistant:

bool BrandedDecl::compileAsType(
    ErrorReporter& errorReporter, schema::Type::Builder target) {
  KJ_IF_SOME(kind, getKind()) {
    switch (kind) {
      case Declaration::ENUM: {
        auto enum_ = target.initEnum();
        enum_.setTypeId(getIdAndFillBrand([&]() { return enum_.initBrand(); }));
        return true;
      }

      case Declaration::STRUCT: {
        auto struct_ = target.initStruct();
        struct_.setTypeId(getIdAndFillBrand([&]() { return struct_.initBrand(); }));
        return true;
      }

      case Declaration::INTERFACE: {
        auto interface = target.initInterface();
        interface.setTypeId(getIdAndFillBrand([&]() { return interface.initBrand(); }));
        return true;
      }

      case Declaration::BUILTIN_LIST: {
        auto elementType = target.initList().initElementType();

        KJ_IF_SOME(param, getListParam()) {
          if (!param.compileAsType(errorReporter, elementType)) {
            return false;
          }
        } else {
          addError(errorReporter, "'List' requires exactly one parameter.");
          return false;
        }

        if (elementType.isAnyPointer()) {
          auto unconstrained = elementType.getAnyPointer().getUnconstrained();

          if (unconstrained.isAnyKind()) {
            addError(errorReporter, "'List(AnyPointer)' is not supported.");
            // Seeing List(AnyPointer) later can mess things up, so change the type to Void.
            elementType.setVoid();
            return false;
          } else if (unconstrained.isStruct()) {
            addError(errorReporter, "'List(AnyStruct)' is not supported.");
            // Seeing List(AnyStruct) later can mess things up, so change the type to Void.
            elementType.setVoid();
            return false;
          }
        }

        return true;
      }

      case Declaration::BUILTIN_VOID: target.setVoid(); return true;
      case Declaration::BUILTIN_BOOL: target.setBool(); return true;
      case Declaration::BUILTIN_INT8: target.setInt8(); return true;
      case Declaration::BUILTIN_INT16: target.setInt16(); return true;
      case Declaration::BUILTIN_INT32: target.setInt32(); return true;
      case Declaration::BUILTIN_INT64: target.setInt64(); return true;
      case Declaration::BUILTIN_U_INT8: target.setUint8(); return true;
      case Declaration::BUILTIN_U_INT16: target.setUint16(); return true;
      case Declaration::BUILTIN_U_INT32: target.setUint32(); return true;
      case Declaration::BUILTIN_U_INT64: target.setUint64(); return true;
      case Declaration::BUILTIN_FLOAT32: target.setFloat32(); return true;
      case Declaration::BUILTIN_FLOAT64: target.setFloat64(); return true;
      case Declaration::BUILTIN_TEXT: target.setText(); return true;
      case Declaration::BUILTIN_DATA: target.setData(); return true;

      case Declaration::BUILTIN_OBJECT:
        addError(errorReporter,
            "As of Cap'n Proto 0.4, 'Object' has been renamed to 'AnyPointer'.  Sorry for the "
            "inconvenience, and thanks for being an early adopter.  :)");
        KJ_FALLTHROUGH;
      case Declaration::BUILTIN_ANY_POINTER:
        target.initAnyPointer().initUnconstrained().setAnyKind();
        return true;
      case Declaration::BUILTIN_ANY_STRUCT:
        target.initAnyPointer().initUnconstrained().setStruct();
        return true;
      case Declaration::BUILTIN_ANY_LIST:
        target.initAnyPointer().initUnconstrained().setList();
        return true;
      case Declaration::BUILTIN_CAPABILITY:
        target.initAnyPointer().initUnconstrained().setCapability();
        return true;

      case Declaration::FILE:
      case Declaration::USING:
      case Declaration::CONST:
      case Declaration::ENUMERANT:
      case Declaration::FIELD:
      case Declaration::UNION:
      case Declaration::GROUP:
      case Declaration::METHOD:
      case Declaration::ANNOTATION:
      case Declaration::NAKED_ID:
      case Declaration::NAKED_ANNOTATION:
        addError(errorReporter, kj::str("'", toString(), "' is not a type."));
        return false;
    }

    KJ_UNREACHABLE;
  }